

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool __thiscall parser::state::set_memo(state *this,posn *p,ind id,memo *m)

{
  ind iVar1;
  _Elt_pointer puVar2;
  bool bVar3;
  memo *in_RCX;
  posn *in_RSI;
  memo *in_RDI;
  ind ii;
  ind i;
  ulong local_38;
  bool local_1;
  
  bVar3 = parser::posn::operator<(in_RSI,(posn *)&(in_RDI->end).cl);
  if (bVar3) {
    local_1 = false;
  }
  else {
    iVar1 = in_RSI->i;
    puVar2 = (_Elt_pointer)(in_RDI->end).cl;
    for (local_38 = std::
                    deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                    ::size((deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                            *)0x1ad1e2); local_38 <= iVar1 - (long)puVar2; local_38 = local_38 + 1)
    {
      std::
      deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
      ::emplace_back<>((deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                        *)in_RDI);
    }
    std::
    deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
    ::operator[]((deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                  *)in_RDI,(size_type)in_RCX);
    std::
    unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>
    ::operator[]((unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>
                  *)in_RDI,(key_type *)in_RCX);
    parser::memo::operator=(in_RDI,in_RCX);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool set_memo(const struct posn& p, ind id, const struct memo& m) {
			// ignore forgotten position
			if ( p < off ) return false;
			
			// ensure table initialized
			ind i = p.i - off.i;
			for (ind ii = memo_table.size(); ii <= i; ++ii) memo_table.emplace_back();
			
			// set table entry
			memo_table[i][id] = m;
			return true;
		}